

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

FUNCTION_RETURN __thiscall license::Project::initialize(Project *this)

{
  FUNCTION_RETURN FVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  runtime_error *prVar4;
  string *psVar5;
  pointer pCVar6;
  string local_480 [8];
  string private_key_file_str;
  string privateKey;
  ofstream ofs;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> local_240;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> cryptoHelper;
  FUNCTION_RETURN result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  path local_1a8;
  path local_188;
  path local_168;
  path local_148;
  byte local_121;
  undefined1 local_120 [7];
  bool keyFilesExist;
  undefined1 local_100 [8];
  path privateKeyFile;
  undefined1 local_c0 [8];
  path publicKeyFile;
  path include_folder;
  path local_70;
  path local_50;
  undefined1 local_30 [8];
  path destinationDir;
  Project *this_local;
  
  destinationDir.m_pathname.field_2._8_8_ = this;
  boost::filesystem::path::path(&local_50,&this->m_project_folder);
  boost::filesystem::path::path(&local_70,&this->m_name);
  boost::filesystem::operator/((path *)local_30,&local_50,&local_70);
  boost::filesystem::path::~path(&local_70);
  boost::filesystem::path::~path(&local_50);
  publicKeyFolder((path *)((long)&publicKeyFile.m_pathname.field_2 + 8),(path *)local_30,
                  &this->m_name);
  boost::filesystem::path::path
            ((path *)((long)&privateKeyFile.m_pathname.field_2 + 8),"public_key.h");
  boost::filesystem::operator/
            ((path *)local_c0,(path *)((long)&publicKeyFile.m_pathname.field_2 + 8),
             (path *)((long)&privateKeyFile.m_pathname.field_2 + 8));
  boost::filesystem::path::~path((path *)((long)&privateKeyFile.m_pathname.field_2 + 8));
  boost::filesystem::path::path((path *)local_120,"private_key.rsa");
  boost::filesystem::operator/((path *)local_100,(path *)local_30,(path *)local_120);
  boost::filesystem::path::~path((path *)local_120);
  local_121 = 0;
  bVar2 = boost::filesystem::exists((path *)local_30);
  if (bVar2) {
    boost::filesystem::path::path(&local_168,"private_key.rsa");
    boost::filesystem::operator/(&local_148,(path *)local_30,&local_168);
    local_121 = boost::filesystem::exists(&local_148);
    boost::filesystem::path::~path(&local_148);
    boost::filesystem::path::~path(&local_168);
    if (((this->m_force_overwrite & 1U) != 0) && ((local_121 & 1) != 0)) {
      local_121 = 0;
      boost::filesystem::path::path(&local_1a8,"private_key.rsa");
      boost::filesystem::operator/(&local_188,(path *)local_30,&local_1a8);
      boost::filesystem::remove((char *)&local_188);
      boost::filesystem::path::~path(&local_188);
      boost::filesystem::path::~path(&local_1a8);
      boost::filesystem::remove(local_c0);
    }
    bVar2 = boost::filesystem::exists((path *)((long)&publicKeyFile.m_pathname.field_2 + 8));
    if ((!bVar2) &&
       (bVar2 = boost::filesystem::create_directories
                          ((path *)((long)&publicKeyFile.m_pathname.field_2 + 8)), !bVar2)) {
      local_1e9 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      psVar5 = boost::filesystem::path::string_abi_cxx11_
                         ((path *)((long)&publicKeyFile.m_pathname.field_2 + 8));
      std::operator+(&local_1e8,"Cannot create public key directory [",psVar5);
      std::operator+(&local_1c8,&local_1e8,"]");
      std::runtime_error::runtime_error(prVar4,(string *)&local_1c8);
      local_1e9 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar2 = boost::filesystem::create_directories((path *)local_30);
    if ((!bVar2) ||
       (bVar2 = boost::filesystem::create_directories
                          ((path *)((long)&publicKeyFile.m_pathname.field_2 + 8)), !bVar2)) {
      cryptoHelper._M_t.
      super___uniq_ptr_impl<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>._M_t
      .super__Tuple_impl<0UL,_license::CryptoHelper_*,_std::default_delete<license::CryptoHelper>_>.
      super__Head_base<0UL,_license::CryptoHelper_*,_false>._M_head_impl._7_1_ = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      psVar5 = boost::filesystem::path::string_abi_cxx11_((path *)local_30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     "Cannot create destination directory [",psVar5);
      std::operator+(&local_210,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     "]");
      std::runtime_error::runtime_error(prVar4,(string *)&local_210);
      cryptoHelper._M_t.
      super___uniq_ptr_impl<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>._M_t
      .super__Tuple_impl<0UL,_license::CryptoHelper_*,_std::default_delete<license::CryptoHelper>_>.
      super__Head_base<0UL,_license::CryptoHelper_*,_false>._M_head_impl._7_1_ = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  cryptoHelper._M_t.
  super___uniq_ptr_impl<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>._M_t.
  super__Tuple_impl<0UL,_license::CryptoHelper_*,_std::default_delete<license::CryptoHelper>_>.
  super__Head_base<0UL,_license::CryptoHelper_*,_false>._M_head_impl._0_4_ = FUNC_RET_OK;
  CryptoHelper::getInstance();
  if ((local_121 & 1) == 0) {
    std::ofstream::ofstream((void *)((long)&privateKey.field_2 + 8));
    pCVar6 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
             operator->(&local_240);
    (**pCVar6->_vptr_CryptoHelper)();
    pCVar6 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
             operator->(&local_240);
    (*pCVar6->_vptr_CryptoHelper[1])((undefined1 *)((long)&private_key_file_str.field_2 + 8));
    psVar5 = boost::filesystem::path::string_abi_cxx11_((path *)local_100);
    std::__cxx11::string::string(local_480,(string *)psVar5);
    _Var3 = std::__cxx11::string::c_str();
    std::operator|(_S_trunc,_S_bin);
    std::ofstream::open(privateKey.field_2._M_local_buf + 8,_Var3);
    std::operator<<((ostream *)(privateKey.field_2._M_local_buf + 8),
                    (string *)(private_key_file_str.field_2._M_local_buf + 8));
    std::ofstream::close();
    psVar5 = boost::filesystem::path::string_abi_cxx11_
                       ((path *)((long)&publicKeyFile.m_pathname.field_2 + 8));
    exportPublicKey(this,psVar5,&local_240);
    std::__cxx11::string::~string(local_480);
    std::__cxx11::string::~string((string *)(private_key_file_str.field_2._M_local_buf + 8));
    std::ofstream::~ofstream((void *)((long)&privateKey.field_2 + 8));
  }
  else {
    bVar2 = boost::filesystem::exists((path *)local_c0);
    if (!bVar2) {
      pCVar6 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
               operator->(&local_240);
      psVar5 = boost::filesystem::path::string_abi_cxx11_((path *)local_100);
      (*pCVar6->_vptr_CryptoHelper[3])(pCVar6,psVar5);
      psVar5 = boost::filesystem::path::string_abi_cxx11_
                         ((path *)((long)&publicKeyFile.m_pathname.field_2 + 8));
      exportPublicKey(this,psVar5,&local_240);
    }
  }
  FVar1 = (FUNCTION_RETURN)
          cryptoHelper._M_t.
          super___uniq_ptr_impl<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>.
          _M_t.
          super__Tuple_impl<0UL,_license::CryptoHelper_*,_std::default_delete<license::CryptoHelper>_>
          .super__Head_base<0UL,_license::CryptoHelper_*,_false>._M_head_impl;
  std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::~unique_ptr
            (&local_240);
  boost::filesystem::path::~path((path *)local_100);
  boost::filesystem::path::~path((path *)local_c0);
  boost::filesystem::path::~path((path *)((long)&publicKeyFile.m_pathname.field_2 + 8));
  boost::filesystem::path::~path((path *)local_30);
  return FVar1;
}

Assistant:

FUNCTION_RETURN Project::initialize() {
	const fs::path destinationDir(fs::path(m_project_folder) / m_name);
	const fs::path include_folder(publicKeyFolder(destinationDir, m_name));
	const fs::path publicKeyFile(include_folder / PUBLIC_KEY_INC_FNAME);
	const fs::path privateKeyFile(destinationDir / PRIVATE_KEY_FNAME);
	bool keyFilesExist = false;
	if (fs::exists(destinationDir)) {
		keyFilesExist = fs::exists(destinationDir / PRIVATE_KEY_FNAME);
		if (m_force_overwrite && keyFilesExist) {
			keyFilesExist = false;
			fs::remove(destinationDir / PRIVATE_KEY_FNAME);
			fs::remove(publicKeyFile);
		}
		if (!fs::exists(include_folder)) {
			if (!fs::create_directories(include_folder)) {
				throw std::runtime_error("Cannot create public key directory [" + include_folder.string() + "]");
			}
		}
	} else if (!fs::create_directories(destinationDir) || !fs::create_directories(include_folder)) {
		throw std::runtime_error("Cannot create destination directory [" + destinationDir.string() + "]");
	}
	FUNCTION_RETURN result = FUNC_RET_OK;
	unique_ptr<CryptoHelper> cryptoHelper(CryptoHelper::getInstance());
	if (keyFilesExist) {
		if (!fs::exists(publicKeyFile)) {
			// how strange, private key was found, but public key is not.
			// Let's regenerate public key
			cryptoHelper->loadPrivateKey_file(privateKeyFile.string());
			exportPublicKey(include_folder.string(), cryptoHelper);
		}
	} else {
		ofstream ofs;
		cryptoHelper->generateKeyPair();
		const std::string privateKey = cryptoHelper->exportPrivateKey();
		const string private_key_file_str = privateKeyFile.string();
		ofs.open(private_key_file_str.c_str(), std::fstream::trunc | std::fstream::binary);
		ofs << privateKey;
		ofs.close();
		exportPublicKey(include_folder.string(), cryptoHelper);
	}
	return result;
}